

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

void __thiscall
pbrt::PaddedSobolSampler::PaddedSobolSampler
          (PaddedSobolSampler *this,int spp,RandomizeStrategy randomizer)

{
  int32_t iVar1;
  int local_1c;
  
  local_1c = spp;
  iVar1 = RoundUpPow2(spp);
  this->samplesPerPixel = iVar1;
  this->randomizeStrategy = randomizer;
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  this->sampleIndex = 0;
  this->dimension = 0;
  if (POPCOUNT(spp) != 1) {
    Warning<int&,int&>("Pixel samples being rounded up to power of 2 (from %d to %d).",&local_1c,
                       &this->samplesPerPixel);
  }
  return;
}

Assistant:

PaddedSobolSampler::PaddedSobolSampler(int spp, RandomizeStrategy randomizer)
    : samplesPerPixel(RoundUpPow2(spp)), randomizeStrategy(randomizer) {
    if (!IsPowerOf2(spp))
        Warning("Pixel samples being rounded up to power of 2 (from %d to %d).", spp,
                samplesPerPixel);
}